

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tbx.c
# Opt level: O1

void tbx_set_meta(tbx_t *tbx)

{
  uint uVar1;
  uint *puVar2;
  char *pcVar3;
  undefined8 uVar4;
  void *__ptr;
  size_t sVar5;
  uint8_t *meta;
  byte bVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  
  puVar2 = (uint *)tbx->dict;
  __ptr = malloc((ulong)puVar2[1] << 3);
  uVar1 = *puVar2;
  if ((ulong)uVar1 == 0) {
    iVar7 = 0;
  }
  else {
    lVar9 = *(long *)(puVar2 + 4);
    bVar6 = 0;
    uVar8 = 0;
    iVar7 = 0;
    do {
      if ((*(uint *)(lVar9 + (uVar8 >> 4 & 0xfffffff) * 4) >> (bVar6 & 0x1e) & 3) == 0) {
        pcVar3 = *(char **)(*(long *)(puVar2 + 6) + uVar8 * 8);
        *(char **)((long)__ptr + *(long *)(*(long *)(puVar2 + 8) + uVar8 * 8) * 8) = pcVar3;
        sVar5 = strlen(pcVar3);
        iVar7 = iVar7 + (int)sVar5 + 1;
      }
      uVar8 = uVar8 + 1;
      bVar6 = bVar6 + 2;
    } while (uVar1 != uVar8);
  }
  meta = (uint8_t *)malloc((long)(iVar7 + 0x1c));
  uVar4 = *(undefined8 *)&(tbx->conf).bc;
  *(undefined8 *)meta = *(undefined8 *)&tbx->conf;
  *(undefined8 *)(meta + 8) = uVar4;
  *(undefined8 *)(meta + 0x10) = *(undefined8 *)&(tbx->conf).meta_char;
  *(int *)(meta + 0x18) = iVar7;
  if ((int)puVar2[1] < 1) {
    iVar7 = 0x1c;
  }
  else {
    iVar7 = 0x1c;
    lVar9 = 0;
    do {
      pcVar3 = *(char **)((long)__ptr + lVar9 * 8);
      sVar5 = strlen(pcVar3);
      memcpy(meta + iVar7,pcVar3,(long)((int)sVar5 + 1));
      iVar7 = iVar7 + (int)sVar5 + 1;
      lVar9 = lVar9 + 1;
    } while (lVar9 < (int)puVar2[1]);
  }
  free(__ptr);
  hts_idx_set_meta(tbx->idx,iVar7,meta,0);
  return;
}

Assistant:

void tbx_set_meta(tbx_t *tbx)
{
    int i, l = 0, l_nm;
    uint32_t x[7];
    char **name;
    uint8_t *meta;
    khint_t k;
    khash_t(s2i) *d = (khash_t(s2i)*)tbx->dict;

    memcpy(x, &tbx->conf, 24);
    name = (char**)malloc(sizeof(char*) * kh_size(d));
    for (k = kh_begin(d), l = 0; k != kh_end(d); ++k) {
        if (!kh_exist(d, k)) continue;
        name[kh_val(d, k)] = (char*)kh_key(d, k);
        l += strlen(kh_key(d, k)) + 1; // +1 to include '\0'
    }
    l_nm = x[6] = l;
    meta = (uint8_t*)malloc(l_nm + 28);
    if (ed_is_big())
        for (i = 0; i < 7; ++i)
            x[i] = ed_swap_4(x[i]);
    memcpy(meta, x, 28);
    for (l = 28, i = 0; i < (int)kh_size(d); ++i) {
        int x = strlen(name[i]) + 1;
        memcpy(meta + l, name[i], x);
        l += x;
    }
    free(name);
    hts_idx_set_meta(tbx->idx, l, meta, 0);
}